

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-port.cc
# Opt level: O2

void testing::internal::CaptureStream(int fd,char *stream_name,CapturedStream **stream)

{
  ostream *poVar1;
  CapturedStream *this;
  GTestLog local_1c;
  
  if (*stream != (CapturedStream *)0x0) {
    GTestLog::GTestLog(&local_1c,GTEST_FATAL,
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/build_O2/googletest-src/googletest/src/gtest-port.cc"
                       ,0x4b0);
    poVar1 = std::operator<<((ostream *)&std::cerr,"Only one ");
    poVar1 = std::operator<<(poVar1,stream_name);
    std::operator<<(poVar1," capturer can exist at a time.");
    GTestLog::~GTestLog(&local_1c);
  }
  this = (CapturedStream *)operator_new(0x28);
  CapturedStream::CapturedStream(this,fd);
  *stream = this;
  return;
}

Assistant:

static void CaptureStream(int fd, const char* stream_name,
                          CapturedStream** stream) {
  if (*stream != nullptr) {
    GTEST_LOG_(FATAL) << "Only one " << stream_name
                      << " capturer can exist at a time.";
  }
  *stream = new CapturedStream(fd);
}